

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O0

void __thiscall
compiler::CompilerAstWalker::onEnterLiteralExpressionAstNode
          (CompilerAstWalker *this,LiteralExpressionAstNode *node)

{
  bool bVar1;
  element_type *peVar2;
  size_t sVar3;
  longlong t;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  string *psVar7;
  double t_00;
  allocator<char> local_d1;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  size_t local_90;
  size_t index_2;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  size_t index_1;
  int64_t val_1;
  size_t index;
  double val;
  string local_38;
  LiteralExpressionAstNode *local_18;
  LiteralExpressionAstNode *node_local;
  CompilerAstWalker *this_local;
  
  local_18 = node;
  node_local = (LiteralExpressionAstNode *)this;
  peVar2 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &node->token);
  switch(peVar2->tokenType) {
  case BooleanLiteral:
    peVar2 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &local_18->token);
    bVar1 = std::operator==(&peVar2->value,"true");
    if (bVar1) {
      emit(this,LoadBooleanTrueConstant);
    }
    else {
      peVar2 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &local_18->token);
      bVar1 = std::operator==(&peVar2->value,"false");
      if (bVar1) {
        emit(this,LoadBooleanFalseConstant);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,
                   "Encountered unknown boolean literal value in AstCompiler.cpp onEnterLiteralExpressionAstNode"
                   ,(allocator<char> *)((long)&val + 7));
        Error::assertWithPanic(false,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        std::allocator<char>::~allocator((allocator<char> *)((long)&val + 7));
      }
    }
    break;
  case UndefinedLiteral:
    emit(this,LoadUndefinedConstant);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,
               "Encountered unknown literal type in AstCompiler.cpp onEnterLiteralExpressionAstNode"
               ,&local_d1);
    Error::assertWithPanic(false,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    break;
  case StringLiteral:
    peVar2 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &local_18->token);
    std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &local_18->token);
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)&i,(ulong)peVar2);
    for (index_2 = 0; sVar3 = index_2, uVar4 = std::__cxx11::string::length(), sVar3 < uVar4;
        index_2 = index_2 + 1) {
      pcVar5 = (char *)std::__cxx11::string::at((ulong)&i);
      sVar3 = index_2;
      if (((*pcVar5 == '\\') && (lVar6 = std::__cxx11::string::length(), sVar3 < lVar6 - 1U)) &&
         (pcVar5 = (char *)std::__cxx11::string::at((ulong)&i), *pcVar5 == 'n')) {
        psVar7 = (string *)std::__cxx11::string::replace((ulong)&i,index_2,(char *)0x2);
        std::__cxx11::string::operator=((string *)&i,psVar7);
      }
    }
    std::__cxx11::string::string((string *)&local_b0,(string *)&i);
    sVar3 = indexOfConstant<std::__cxx11::string>
                      (this,&local_b0,&this->stringConstants,&this->stringConstantsLookup);
    std::__cxx11::string::~string((string *)&local_b0);
    local_90 = sVar3;
    emit(this,LoadStringConstant,sVar3);
    std::__cxx11::string::~string((string *)&i);
    break;
  case IntegerLiteral:
    peVar2 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &local_18->token);
    t = std::__cxx11::stoll(&peVar2->value,(size_t *)0x0,10);
    str.field_2._8_8_ = indexOfConstant<long>(this,t,&this->intConstants,&this->intConstantsLookup);
    emit(this,LoadIntegerConstant,str.field_2._8_8_);
    break;
  case FloatLiteral:
    peVar2 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &local_18->token);
    t_00 = std::__cxx11::stod(&peVar2->value,(size_t *)0x0);
    sVar3 = indexOfConstant<double>(this,t_00,&this->floatConstants,&this->floatConstantsLookup);
    emit(this,LoadFloatConstant,sVar3);
  }
  return;
}

Assistant:

void onEnterLiteralExpressionAstNode(LiteralExpressionAstNode* node) noexcept override {
    switch (node->token->tokenType) {
      case TokenType::BooleanLiteral: {
        if (node->token->value == "true") {
          this->emit(bytecode::ByteCodeInstruction::LoadBooleanTrueConstant);
        } else if (node->token->value == "false") {
          this->emit(bytecode::ByteCodeInstruction::LoadBooleanFalseConstant);
        } else {
          Error::assertWithPanic(false, "Encountered unknown boolean literal value in AstCompiler.cpp onEnterLiteralExpressionAstNode");
        }
        return;
      }
      case TokenType::FloatLiteral: {
        double val = std::stod(node->token->value);
        std::size_t index = this->indexOfConstant(val, this->floatConstants, this->floatConstantsLookup);
        this->emit(bytecode::ByteCodeInstruction::LoadFloatConstant, index);
        return;
      }
      case TokenType::IntegerLiteral: {
        std::int64_t val = std::stoll(node->token->value);
        std::size_t index = this->indexOfConstant(val, this->intConstants, this->intConstantsLookup);
        this->emit(bytecode::ByteCodeInstruction::LoadIntegerConstant, index);
        return;
      }
      case TokenType::UndefinedLiteral: {
        this->emit(bytecode::ByteCodeInstruction::LoadUndefinedConstant);
        return;
      }
      case TokenType::StringLiteral: {
        auto str = node->token->value.substr(1, node->token->value.length() - 2);
        for (std::size_t i = 0; i < str.length(); i++) {
          if (str.at(i) == '\\' && i < str.length() - 1 && str.at(i + 1) == 'n') {
            str = str.replace(i, 2, "\n");
          }
        }
        std::size_t index = this->indexOfConstant(str, this->stringConstants, this->stringConstantsLookup);
        this->emit(bytecode::ByteCodeInstruction::LoadStringConstant, index);
        return;
      }
      default: {
        Error::assertWithPanic(false, "Encountered unknown literal type in AstCompiler.cpp onEnterLiteralExpressionAstNode");
        return;
      }
    }
  }